

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

void __thiscall OpenMD::Integrator::initialize(Integrator *this)

{
  double dVar1;
  _Head_base<0UL,_OpenMD::ProgressBar_*,_false> __p;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RealType RVar4;
  _Head_base<0UL,_OpenMD::ProgressBar_*,_false> local_18;
  
  ForceManager::initialize(this->forceMan_);
  if ((this->simParams->ConserveLinearMomentum).super_ParameterBase.field_0x2b == '\x01') {
    Velocitizer::removeComDrift
              ((this->velocitizer_)._M_t.
               super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
               .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
  }
  (*this->flucQ_->_vptr_FluctuatingChargePropagator[2])();
  (*this->_vptr_Integrator[5])(this);
  uVar2 = SimInfo::getNGlobalConstraints(this->info_);
  if (uVar2 != 0) {
    Rattle::constraintA(this->rattle_);
    (*this->_vptr_Integrator[5])(this);
    Rattle::constraintB(this->rattle_);
    (*this->info_->sman_->_vptr_SnapshotManager[2])();
  }
  if (this->needVelocityScaling == true) {
    Velocitizer::randomize
              ((this->velocitizer_)._M_t.
               super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
               .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl,
               this->targetScalingTemp);
  }
  iVar3 = (*this->_vptr_Integrator[0xb])(this);
  this->dumpWriter = (DumpWriter *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->_vptr_Integrator[0xc])(this);
  this->statWriter = (StatWriter *)CONCAT44(extraout_var_00,iVar3);
  DumpWriter::writeDumpAndEor(this->dumpWriter);
  std::make_unique<OpenMD::ProgressBar>();
  __p._M_head_impl = local_18._M_head_impl;
  local_18._M_head_impl = (ProgressBar *)0x0;
  std::__uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::reset
            ((__uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             &this->progressBar,__p._M_head_impl);
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)&local_18
            );
  saveConservedQuantity(this);
  Stats::collectStats(this->stats);
  if (this->useRNEMD == true) {
    RNEMD::RNEMD::getStarted
              ((this->rnemd_)._M_t.
               super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
               .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl);
  }
  StatWriter::writeStat(this->statWriter);
  dVar1 = this->sampleTime;
  RVar4 = Snapshot::getTime(this->snap);
  this->currSample = RVar4 + dVar1;
  dVar1 = this->statusTime;
  RVar4 = Snapshot::getTime(this->snap);
  this->currStatus = RVar4 + dVar1;
  dVar1 = this->thermalTime;
  RVar4 = Snapshot::getTime(this->snap);
  this->currThermal = RVar4 + dVar1;
  if (this->needReset == true) {
    dVar1 = this->resetTime;
    RVar4 = Snapshot::getTime(this->snap);
    this->currReset = RVar4 + dVar1;
  }
  if (this->useRNEMD == true) {
    dVar1 = this->RNEMD_exchangeTime;
    RVar4 = Snapshot::getTime(this->snap);
    this->currRNEMD = RVar4 + dVar1;
  }
  this->needPotential = false;
  this->needVirial = false;
  return;
}

Assistant:

void Integrator::initialize() {
    forceMan_->initialize();

    // remove center of mass drift velocity (in case we passed in a
    // configuration that was drifting)
    if (simParams->getConserveLinearMomentum()) velocitizer_->removeComDrift();

    // find the initial fluctuating charges.
    flucQ_->initialize();
    // initialize the forces before the first step
    calcForce();
    // execute the constraint algorithm to make sure that the system is
    // constrained at the very beginning
    if (info_->getNGlobalConstraints() > 0) {
      rattle_->constraintA();
      calcForce();
      rattle_->constraintB();
      // copy the current snapshot to previous snapshot
      info_->getSnapshotManager()->advance();
    }

    if (needVelocityScaling) { velocitizer_->randomize(targetScalingTemp); }

    dumpWriter = createDumpWriter();
    statWriter = createStatWriter();
    dumpWriter->writeDumpAndEor();

    progressBar = std::make_unique<ProgressBar>();

    // save statistics, before writeStat,  we must save statistics
    saveConservedQuantity();
    stats->collectStats();

    if (useRNEMD) rnemd_->getStarted();

    statWriter->writeStat();

    currSample  = sampleTime + snap->getTime();
    currStatus  = statusTime + snap->getTime();
    currThermal = thermalTime + snap->getTime();
    if (needReset) { currReset = resetTime + snap->getTime(); }
    if (useRNEMD) { currRNEMD = RNEMD_exchangeTime + snap->getTime(); }
    needPotential = false;
    needVirial    = false;
  }